

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

ALCchar * DevFmtTypeString(DevFmtType type)

{
  DevFmtType type_local;
  char *local_8;
  
  switch(type) {
  case DevFmtByte:
    local_8 = "Int8";
    break;
  case DevFmtUByte:
    local_8 = "UInt8";
    break;
  case DevFmtShort:
    local_8 = "Int16";
    break;
  case DevFmtUShort:
    local_8 = "UInt16";
    break;
  case DevFmtInt:
    local_8 = "Int32";
    break;
  case DevFmtUInt:
    local_8 = "UInt32";
    break;
  case DevFmtFloat:
    local_8 = "Float32";
    break;
  default:
    local_8 = "(unknown type)";
  }
  return local_8;
}

Assistant:

const ALCchar *DevFmtTypeString(DevFmtType type) noexcept
{
    switch(type)
    {
    case DevFmtByte: return "Int8";
    case DevFmtUByte: return "UInt8";
    case DevFmtShort: return "Int16";
    case DevFmtUShort: return "UInt16";
    case DevFmtInt: return "Int32";
    case DevFmtUInt: return "UInt32";
    case DevFmtFloat: return "Float32";
    }
    return "(unknown type)";
}